

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::anon_unknown_19::writeFragmentPackets
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               FragmentPacket *fragmentPackets,int numRasterizedPackets,FaceType facetype,
               vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *fragmentOutputArray,
               float *depthValues,
               vector<rr::Fragment,_std::allocator<rr::Fragment>_> *fragmentBuffer)

{
  pointer pFVar1;
  pointer pGVar2;
  int iVar3;
  float *pfVar4;
  FragmentOperationState *state_00;
  long lVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  FragmentPacket *a;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  deUint64 fragMask;
  ulong uVar19;
  Vector<int,_2> local_21e0;
  FragmentPacket *local_21d8;
  FragmentOperationState noStencilDepthWriteState;
  FragmentProcessor fragProcessor;
  
  iVar16 = *(int *)&renderTarget->field_0x8;
  lVar17 = (long)(program->fragmentShader->m_outputs).
                 super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(program->fragmentShader->m_outputs).
                 super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  FragmentProcessor::FragmentProcessor(&fragProcessor);
  bVar6 = (byte)iVar16;
  uVar8 = 0;
  uVar9 = (ulong)(uint)numRasterizedPackets;
  if (numRasterizedPackets < 1) {
    uVar9 = uVar8;
  }
  uVar19 = ~(-1L << (bVar6 & 0x3f));
  iVar3 = 0;
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    a = fragmentPackets + uVar8;
    uVar14 = 0;
    local_21d8 = a;
    while (uVar13 = (uint)uVar14, uVar13 != 4) {
      uVar15 = uVar13 & 1;
      bVar7 = ((char)(uVar14 >> 1) + (char)uVar15 * '\x02') * bVar6;
      uVar18 = uVar19 << (bVar7 & 0x3f);
      if ((a->coverage & uVar18) != 0) {
        pFVar1 = (fragmentBuffer->super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_21e0.m_data[1] = (int)(uVar14 >> 1);
        local_21e0.m_data[0] = uVar15;
        tcu::operator+(&a->position,&local_21e0);
        *(undefined8 *)pFVar1[iVar3].pixelCoord.m_data = noStencilDepthWriteState._0_8_;
        pFVar1[iVar3].coverage = (deUint32)((uVar18 & local_21d8->coverage) >> (bVar7 & 0x3f));
        if (depthValues == (float *)0x0) {
          pfVar4 = (float *)0x0;
        }
        else {
          pfVar4 = depthValues + (int)((uVar13 & 2 | (int)uVar8 * 4 | uVar15) * iVar16);
        }
        pFVar1[iVar3].sampleDepths = pfVar4;
        a = local_21d8;
        iVar3 = iVar3 + 1;
      }
      uVar14 = (ulong)(uVar13 + 1);
    }
  }
  lVar10 = lVar17 >> 2;
  FragmentOperationState::FragmentOperationState(&noStencilDepthWriteState,&state->fragOps);
  noStencilDepthWriteState.depthMask = false;
  noStencilDepthWriteState.stencilStates[facetype].sFail = STENCILOP_KEEP;
  noStencilDepthWriteState.stencilStates[facetype].dpFail = STENCILOP_KEEP;
  noStencilDepthWriteState.stencilStates[facetype].dpPass = STENCILOP_KEEP;
  lVar17 = lVar17 * 4;
  lVar11 = 8;
  iVar16 = 0;
  for (lVar5 = 0; lVar5 != lVar10; lVar5 = lVar5 + 1) {
    iVar3 = 0;
    for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      lVar12 = iVar3 * lVar17 + lVar11;
      bVar7 = 0;
      for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
        if ((fragmentPackets[uVar8].coverage &
            uVar19 << ((bVar7 & 2 | (byte)(uVar14 >> 1)) * bVar6 & 0x3f)) != 0) {
          pFVar1 = (fragmentBuffer->super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          pGVar2 = (fragmentOutputArray->
                   super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pFVar1[iVar16].value.v.uData[0] = *(deUint32 *)((long)pGVar2 + lVar12 + -8);
          pFVar1[iVar16].value.v.uData[1] = *(deUint32 *)((long)pGVar2 + lVar12 + -4);
          pFVar1[iVar16].value.v.uData[2] = *(deUint32 *)((long)&pGVar2->v + lVar12);
          pFVar1[iVar16].value.v.uData[3] = *(deUint32 *)((long)&pGVar2->v + lVar12 + 4);
          iVar16 = iVar16 + 1;
        }
        bVar7 = bVar7 + 2;
        lVar12 = lVar12 + lVar17;
      }
      iVar3 = iVar3 + 4;
    }
    state_00 = &noStencilDepthWriteState;
    if (lVar5 == lVar10 + -1) {
      state_00 = &state->fragOps;
    }
    FragmentProcessor::render
              (&fragProcessor,
               (MultisamplePixelBufferAccess *)(&renderTarget->field_0x0 + (long)(int)lVar5 * 0x28),
               &renderTarget->m_depthBuffer,&renderTarget->m_stencilBuffer,
               (fragmentBuffer->super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>).
               _M_impl.super__Vector_impl_data._M_start,iVar16,facetype,state_00);
    lVar11 = lVar11 + 0x10;
  }
  return;
}

Assistant:

void writeFragmentPackets (const RenderState&					state,
						   const RenderTarget&					renderTarget,
						   const Program&						program,
						   const FragmentPacket*				fragmentPackets,
						   int									numRasterizedPackets,
						   rr::FaceType							facetype,
						   const std::vector<rr::GenericVec4>&	fragmentOutputArray,
						   const float*							depthValues,
						   std::vector<Fragment>&				fragmentBuffer)
{
	const int			numSamples		= renderTarget.getNumSamples();
	const size_t		numOutputs		= program.fragmentShader->getOutputs().size();
	FragmentProcessor	fragProcessor;

	DE_ASSERT(fragmentOutputArray.size() >= (size_t)numRasterizedPackets*4*numOutputs);
	DE_ASSERT(fragmentBuffer.size()      >= (size_t)numRasterizedPackets*4);

	// Translate fragments but do not set the value yet
	{
		int	fragCount = 0;
		for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			const FragmentPacket&	packet	= fragmentPackets[packetNdx];
			const int				xo		= fragNdx%2;
			const int				yo		= fragNdx/2;

			if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
			{
				Fragment& fragment		= fragmentBuffer[fragCount++];

				fragment.pixelCoord		= packet.position + tcu::IVec2(xo, yo);
				fragment.coverage		= (deUint32)((packet.coverage & getCoverageFragmentSampleBits(numSamples, xo, yo)) >> getCoverageOffset(numSamples, xo, yo));
				fragment.sampleDepths	= (depthValues) ? (&depthValues[(packetNdx*4 + yo*2 + xo)*numSamples]) : (DE_NULL);
			}
		}
	}

	// Set per output output values
	{
		rr::FragmentOperationState noStencilDepthWriteState(state.fragOps);
		noStencilDepthWriteState.depthMask						= false;
		noStencilDepthWriteState.stencilStates[facetype].sFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpPass	= STENCILOP_KEEP;

		int	fragCount = 0;
		for (size_t outputNdx = 0; outputNdx < numOutputs; ++outputNdx)
		{
			// Only the last output-pass has default state, other passes have stencil & depth writemask=0
			const rr::FragmentOperationState& fragOpsState = (outputNdx == numOutputs-1) ? (state.fragOps) : (noStencilDepthWriteState);

			for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				const FragmentPacket&	packet	= fragmentPackets[packetNdx];
				const int				xo		= fragNdx%2;
				const int				yo		= fragNdx/2;

				// Add only fragments that have live samples to shaded fragments queue.
				if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
				{
					Fragment& fragment		= fragmentBuffer[fragCount++];
					fragment.value			= fragmentOutputArray[(packetNdx*4 + fragNdx) * numOutputs + outputNdx];
				}
			}

			// Execute per-fragment ops and write
			fragProcessor.render(renderTarget.getColorBuffer((int)outputNdx), renderTarget.getDepthBuffer(), renderTarget.getStencilBuffer(), &fragmentBuffer[0], fragCount, facetype, fragOpsState);
		}
	}
}